

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O0

void __thiscall Configurator::Configurator(Configurator *this,streambuf *out_buf)

{
  streambuf *in_RSI;
  string *in_RDI;
  allocator local_11;
  streambuf *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::ostream::ostream(in_RDI + 0x20,local_10);
  return;
}

Assistant:

explicit Configurator(std::streambuf* out_buf) : output(out_buf) {}